

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O2

void linenoise::linenoiseEditBackspace(linenoiseState *l)

{
  int iVar1;
  long lVar2;
  
  if ((0 < l->pos) && (0 < l->len)) {
    iVar1 = unicodePrevGraphemeLen(l->buf,l->pos);
    memmove(l->buf + l->pos + -(long)iVar1,l->buf + l->pos,(long)l->len - (long)l->pos);
    l->pos = l->pos - iVar1;
    lVar2 = (long)l->len - (long)iVar1;
    l->len = (int)lVar2;
    l->buf[lVar2] = '\0';
    refreshSingleLine(l);
    return;
  }
  return;
}

Assistant:

inline void linenoiseEditBackspace(struct linenoiseState *l) {
    if (l->pos > 0 && l->len > 0) {
        int glen = unicodePrevGraphemeLen(l->buf,l->pos);
        memmove(l->buf+l->pos-glen,l->buf+l->pos,l->len-l->pos);
        l->pos-=glen;
        l->len-=glen;
        l->buf[l->len] = '\0';
        refreshLine(l);
    }
}